

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O3

void __thiscall CCDPP_MPI::train(CCDPP_MPI *this)

{
  value_type_conflict1 *_q4d;
  value_type_conflict1 *pvVar1;
  value_type_conflict1 *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer pRVar7;
  pool *ppVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  int iVar14;
  void *pvVar15;
  mapped_type *pmVar16;
  pointer pRVar17;
  ostream *poVar18;
  Parameter *pPVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  bool bVar26;
  value_type_conflict1 vVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  value_type_conflict1 score;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  value_type_conflict1 global_reg_1;
  value_type_conflict1 global_loss;
  value_type_conflict1 global_loss_1;
  value_type_conflict1 loss;
  Monitor timer;
  value_type_conflict1 global_reg;
  ulong local_138;
  void *local_130;
  value_type_conflict1 *local_128;
  double local_120;
  double local_118;
  value_type_conflict1 *local_110;
  value_type_conflict1 *local_108;
  ulong local_100;
  void *local_f8;
  int local_ec;
  double local_e8;
  _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_e0;
  _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_d8;
  void *local_d0;
  ulong local_c8;
  void *local_c0;
  value_type_conflict1 *local_b8;
  double local_b0;
  double local_a8;
  int local_a0;
  timeval local_98;
  timeval local_88;
  double local_78;
  undefined8 uStack_70;
  function0<void> local_68;
  double local_48;
  double local_40;
  double local_38;
  
  uVar24 = (long)this->Q_workload * 8;
  if ((long)this->Q_workload < 0) {
    uVar24 = 0xffffffffffffffff;
  }
  pvVar15 = operator_new__(uVar24);
  uVar24 = (long)this->P_workload * 8;
  if ((long)this->P_workload < 0) {
    uVar24 = 0xffffffffffffffff;
  }
  local_c0 = operator_new__(uVar24);
  uVar24 = (long)this->user_num * 8;
  if ((long)this->user_num < 0) {
    uVar24 = 0xffffffffffffffff;
  }
  local_108 = (value_type_conflict1 *)operator_new__(uVar24);
  uVar24 = (long)this->item_num * 8;
  if ((long)this->item_num < 0) {
    uVar24 = 0xffffffffffffffff;
  }
  local_110 = (value_type_conflict1 *)operator_new__(uVar24);
  local_138 = 0;
  pPVar19 = this->parameter;
  local_d0 = pvVar15;
  if (pPVar19->verbose == true) {
    iVar21 = pPVar19->k;
    if (0 < iVar21) {
      iVar14 = this->start_user_id;
      iVar20 = this->end_user_id;
      iVar25 = 0;
      do {
        if (iVar14 < iVar20) {
          lVar23 = 0;
          do {
            local_b0 = (double)CONCAT44(local_b0._4_4_,iVar14 + (int)lVar23);
            local_78 = this->Q[(long)this->Q_workload * (long)iVar25 + lVar23] *
                       this->Q[(long)this->Q_workload * (long)iVar25 + lVar23];
            pmVar16 = std::__detail::
                      _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&this->user_item_R,(key_type *)&local_b0);
            auVar41._8_8_ = 0;
            auVar41._0_8_ = local_78;
            lVar23 = lVar23 + 1;
            auVar42 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                         (long)(pmVar16->
                                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pmVar16->
                                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start >> 4);
            auVar29._8_8_ = 0;
            auVar29._0_8_ = local_138;
            auVar29 = vfmadd213sd_fma(auVar42,auVar41,auVar29);
            local_138 = auVar29._0_8_;
            iVar20 = this->end_user_id;
            iVar14 = this->start_user_id;
          } while ((int)lVar23 < iVar20 - iVar14);
          iVar21 = this->parameter->k;
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 < iVar21);
    }
    local_b0 = 0.0;
    pRVar17 = (this->train_ratings).super__Vector_base<Rating,_std::allocator<Rating>_>._M_impl.
              super__Vector_impl_data._M_start;
    pRVar7 = (this->train_ratings).super__Vector_base<Rating,_std::allocator<Rating>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pRVar17 != pRVar7) {
      auVar29 = ZEXT816(0) << 0x40;
      do {
        auVar42._8_8_ = 0;
        auVar42._0_8_ = pRVar17->score;
        pRVar17 = pRVar17 + 1;
        auVar29 = vfmadd231sd_fma(auVar29,auVar42,auVar42);
      } while (pRVar17 != pRVar7);
      local_b0 = auVar29._0_8_;
    }
    MPI_Allreduce(&local_138,&local_68,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
    MPI_Allreduce(&local_b0,&local_128,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
    pvVar15 = local_d0;
    if (this->machine_id == 0) {
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_68.super_function_base.vtable;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = this->parameter->lambda;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_128;
      auVar29 = vfmadd213sd_fma(auVar43,auVar30,auVar3);
      local_78 = auVar29._0_8_;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"machine id ",0xb);
      poVar18 = (ostream *)std::ostream::operator<<(&std::cout,this->machine_id);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", iter ",7);
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", rank ",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"None",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", time ",7);
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18," sec, loss ",0xb);
      poVar18 = std::ostream::_M_insert<double>((double)local_128);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", obj ",6);
      poVar18 = std::ostream::_M_insert<double>(local_78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", diff ",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"None",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", reg ",6);
      poVar18 = std::ostream::_M_insert<double>((double)local_68.super_function_base.vtable);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      if (this->machine_id == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"RMSE of training data: ",0x17);
        auVar31._0_8_ = (double)local_128 / (double)this->train_rating_num;
        auVar31._8_8_ = 0;
        if (auVar31._0_8_ < 0.0) {
          dVar28 = sqrt(auVar31._0_8_);
        }
        else {
          auVar29 = vsqrtsd_avx(auVar31,auVar31);
          dVar28 = auVar29._0_8_;
        }
        poVar18 = std::ostream::_M_insert<double>(dVar28);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
      }
    }
    pPVar19 = this->parameter;
  }
  if (pPVar19->max_iter < 1) {
    local_e8 = 0.0;
  }
  else {
    local_e0 = (_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->user_item_R;
    local_d8 = (_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->item_user_R;
    local_118 = 0.0;
    local_e8 = 0.0;
    local_100 = 1;
    do {
      dVar28 = local_118;
      if (0 < pPVar19->k) {
        uVar24 = 0;
        local_ec = 0;
        local_78 = 0.0;
        uStack_70 = 0;
        do {
          local_a0 = 0;
          gettimeofday(&local_98,(__timezone_ptr_t)0x0);
          _q4d = this->Q + this->Q_workload * (int)uVar24;
          pvVar1 = this->P + this->P_workload * (int)uVar24;
          local_f8 = local_c0;
          local_130 = pvVar15;
          local_128 = _q4d;
          local_c8 = uVar24;
          local_b8 = pvVar1;
          if (0 < this->parameter->num_of_thread) {
            iVar21 = 0;
            do {
              ppVar8 = this->thread_pool;
              local_68.super_function_base.functor.members.obj_ref.obj_ptr = operator_new(0x30);
              *(CCDPP_MPI **)local_68.super_function_base.functor.members._0_8_ = this;
              *(void ***)((long)local_68.super_function_base.functor.members._0_8_ + 8) = &local_130
              ;
              *(value_type_conflict1 ***)
               ((long)local_68.super_function_base.functor.members._0_8_ + 0x10) = &local_128;
              *(void ***)((long)local_68.super_function_base.functor.members._0_8_ + 0x18) =
                   &local_f8;
              *(value_type_conflict1 ***)
               ((long)local_68.super_function_base.functor.members._0_8_ + 0x20) = &local_b8;
              *(int *)((long)local_68.super_function_base.functor.members._0_8_ + 0x28) = iVar21;
              local_68.super_function_base.vtable =
                   (vtable_base *)
                   _ZZN5boost9function0IvE9assign_toISt5_BindIFZN9CCDPP_MPI11init_factorEPdS5_S5_S5_EUliE_iEEEEvT_E13stored_vtable
              ;
              boost::threadpool::detail::
              pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
              ::schedule((ppVar8->m_core).px,&local_68);
              boost::function0<void>::~function0(&local_68);
              iVar21 = iVar21 + 1;
            } while (iVar21 < this->parameter->num_of_thread);
          }
          boost::threadpool::detail::
          pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
          ::wait((this->thread_pool->m_core).px,(void *)0x0);
          MPI_Allgather(_q4d,this->Q_workload,&ompi_mpi_double,local_108,this->Q_workload,
                        &ompi_mpi_double,&ompi_mpi_comm_world);
          MPI_Allgather(pvVar1,this->P_workload,&ompi_mpi_double,local_110,this->P_workload,
                        &ompi_mpi_double,&ompi_mpi_comm_world);
          if (4 < local_ec) {
            pPVar19 = this->parameter;
            pvVar15 = local_d0;
            dVar28 = local_118;
            break;
          }
          if (1 < (uint)local_100) {
            update_rating(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                *)local_e0,_q4d,local_110,this->start_user_id,
                          this->R_workload_update_rating,true);
            update_rating(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                *)local_d8,pvVar1,local_108,this->start_item_id,
                          this->Rt_workload_update_rating,true);
          }
          local_68.super_function_base.vtable = (vtable_base *)0x0;
          local_128 = (value_type_conflict1 *)0x0;
          if (0 < this->parameter->max_inner_iter) {
            bVar11 = (int)local_100 == 1;
            bVar12 = (int)local_c8 == 0;
            iVar21 = 0;
            do {
              local_68.super_function_base.vtable = (vtable_base *)0x0;
              vVar27 = rank_one_update(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                             *)local_d8,pvVar1,local_108,this->start_item_id,
                                       this->end_item_id,this->Rt_workload_rank_one_update);
              local_68.super_function_base.vtable =
                   (vtable_base *)(vVar27 + (double)local_68.super_function_base.vtable);
              MPI_Allgather(pvVar1,this->P_workload,&ompi_mpi_double,local_110,this->P_workload,
                            &ompi_mpi_double,&ompi_mpi_comm_world);
              vVar27 = rank_one_update(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                             *)local_e0,_q4d,local_110,this->start_user_id,
                                       this->end_user_id,this->R_workload_rank_one_update);
              local_68.super_function_base.vtable =
                   (vtable_base *)(vVar27 + (double)local_68.super_function_base.vtable);
              MPI_Allgather(_q4d,this->Q_workload,&ompi_mpi_double,local_108,this->Q_workload,
                            &ompi_mpi_double,&ompi_mpi_comm_world);
              MPI_Allreduce(&local_68,&local_128,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                            &ompi_mpi_comm_world);
              auVar13._8_8_ = uStack_70;
              auVar13._0_8_ = local_78;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = local_128;
              if ((double)local_128 < local_78 * this->parameter->eps) {
                local_ec = local_ec + (uint)(iVar21 == 0);
                break;
              }
              bVar26 = iVar21 == 0;
              auVar29 = vmaxsd_avx(auVar32,auVar13);
              iVar21 = iVar21 + 1;
              uStack_70 = auVar29._8_8_;
              local_78 = (double)((ulong)(bVar11 && bVar12) *
                                  ((ulong)bVar26 * (long)local_78 + (ulong)!bVar26 * auVar29._0_8_)
                                 + (ulong)(!bVar11 || !bVar12) * auVar29._0_8_);
            } while (iVar21 < this->parameter->max_inner_iter);
          }
          update_rating(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                              *)local_e0,_q4d,local_110,this->start_user_id,
                        this->R_workload_update_rating,false);
          pvVar15 = local_d0;
          local_b8 = (value_type_conflict1 *)
                     update_rating(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                         *)local_d8,pvVar1,local_108,this->start_user_id,
                                   this->Rt_workload_update_rating,false);
          local_a0 = 1;
          gettimeofday(&local_88,(__timezone_ptr_t)0x0);
          if (local_a0 == 0) {
            gettimeofday(&local_88,(__timezone_ptr_t)0x0);
          }
          auVar33._0_8_ = (double)local_98.tv_sec;
          auVar33._8_8_ = in_XMM4_Qb;
          auVar47._0_8_ = (double)local_98.tv_usec;
          auVar47._8_8_ = in_XMM4_Qb;
          auVar29 = vfmadd231sd_fma(auVar47,ZEXT816(0x412e848000000000),auVar33);
          local_b0 = auVar29._0_8_;
          auVar34._0_8_ = (double)local_88.tv_sec;
          auVar34._8_8_ = in_XMM4_Qb;
          auVar51._0_8_ = (double)local_88.tv_usec;
          auVar51._8_8_ = in_XMM4_Qb;
          auVar29 = vfmadd231sd_fma(auVar51,ZEXT816(0x412e848000000000),auVar34);
          local_a8 = auVar29._0_8_;
          local_38 = (local_a8 - local_b0) * 1e-06;
          pPVar19 = this->parameter;
          local_48 = local_a8;
          local_40 = local_b0;
          if (pPVar19->verbose == true) {
            uVar24 = (ulong)(uint)this->start_item_id;
            if (this->start_item_id < this->end_item_id) {
              lVar23 = 0;
              do {
                local_130 = (void *)CONCAT44(local_130._4_4_,(int)uVar24 + (int)lVar23);
                pmVar16 = std::__detail::
                          _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](local_d8,(key_type *)&local_130);
                pvVar2 = pvVar1 + lVar23;
                auVar44._8_8_ = 0;
                auVar44._0_8_ = *pvVar2;
                dVar28 = *(double *)((long)local_c0 + lVar23 * 8);
                auVar52._8_8_ = 0;
                auVar52._0_8_ = dVar28;
                lVar23 = lVar23 + 1;
                auVar9._8_8_ = in_XMM4_Qb;
                auVar9._0_8_ = in_XMM4_Qa;
                auVar29 = vcvtusi2sd_avx512f(auVar9,(long)(pmVar16->
                                                                                                                    
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar16->
                                                                                                                
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 4);
                auVar4._8_8_ = 0;
                auVar4._0_8_ = local_138;
                auVar48._8_8_ = 0;
                auVar48._0_8_ = *pvVar2 * auVar29._0_8_;
                auVar42 = vfmadd213sd_fma(auVar48,auVar44,auVar4);
                auVar35._8_8_ = 0;
                auVar35._0_8_ = auVar29._0_8_ * dVar28;
                auVar29 = vfnmadd213sd_fma(auVar35,auVar52,auVar42);
                local_138 = auVar29._0_8_;
                uVar24 = (ulong)this->start_item_id;
              } while (lVar23 < (long)((long)this->end_item_id - uVar24));
            }
            uVar24 = (ulong)(uint)this->start_user_id;
            if (this->start_user_id < this->end_user_id) {
              lVar23 = 0;
              do {
                local_130 = (void *)CONCAT44(local_130._4_4_,(int)uVar24 + (int)lVar23);
                pmVar16 = std::__detail::
                          _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](local_e0,(key_type *)&local_130);
                pvVar1 = _q4d + lVar23;
                auVar45._8_8_ = 0;
                auVar45._0_8_ = *pvVar1;
                dVar28 = *(double *)((long)pvVar15 + lVar23 * 8);
                auVar53._8_8_ = 0;
                auVar53._0_8_ = dVar28;
                lVar23 = lVar23 + 1;
                auVar10._8_8_ = in_XMM4_Qb;
                auVar10._0_8_ = in_XMM4_Qa;
                auVar29 = vcvtusi2sd_avx512f(auVar10,(long)(pmVar16->
                                                                                                                      
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar16->
                                                                                                                
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 4);
                auVar5._8_8_ = 0;
                auVar5._0_8_ = local_138;
                auVar49._8_8_ = 0;
                auVar49._0_8_ = *pvVar1 * auVar29._0_8_;
                auVar42 = vfmadd213sd_fma(auVar49,auVar45,auVar5);
                auVar36._8_8_ = 0;
                auVar36._0_8_ = auVar29._0_8_ * dVar28;
                auVar29 = vfnmadd213sd_fma(auVar36,auVar53,auVar42);
                local_138 = auVar29._0_8_;
                uVar24 = (ulong)this->start_user_id;
              } while (lVar23 < (long)((long)this->end_user_id - uVar24));
            }
            MPI_Allreduce(&local_138,&local_130,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                          &ompi_mpi_comm_world);
            MPI_Allreduce(&local_b8,&local_f8,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                          &ompi_mpi_comm_world);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = local_130;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = this->parameter->lambda;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_f8;
            auVar29 = vfmadd213sd_fma(auVar46,auVar37,auVar6);
            local_120 = auVar29._0_8_;
            if (this->machine_id == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"machine id ",0xb);
              poVar18 = (ostream *)std::ostream::operator<<(&std::cout,this->machine_id);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,", iter ",7);
              poVar18 = (ostream *)std::ostream::operator<<(poVar18,(int)local_100);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,", rank ",7);
              poVar18 = (ostream *)std::ostream::operator<<(poVar18,(int)local_c8 + 1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,", time ",7);
              dVar28 = local_38;
              if (local_a0 == 0) {
                gettimeofday(&local_88,(__timezone_ptr_t)0x0);
                auVar38._0_8_ = (double)local_98.tv_sec;
                auVar38._8_8_ = in_XMM4_Qb;
                auVar50._0_8_ = (double)local_98.tv_usec;
                auVar50._8_8_ = in_XMM4_Qb;
                auVar29 = vfmadd231sd_fma(auVar50,ZEXT816(0x412e848000000000),auVar38);
                auVar39._0_8_ = (double)local_88.tv_sec;
                auVar39._8_8_ = in_XMM4_Qb;
                auVar54._0_8_ = (double)local_88.tv_usec;
                auVar54._8_8_ = in_XMM4_Qb;
                local_40 = auVar29._0_8_;
                auVar29 = vfmadd231sd_fma(auVar54,ZEXT816(0x412e848000000000),auVar39);
                local_48 = auVar29._0_8_;
                dVar28 = (local_48 - local_40) * 1e-06;
              }
              local_b0 = local_40;
              local_a8 = local_48;
              poVar18 = std::ostream::_M_insert<double>(dVar28);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," sec, loss ",0xb);
              poVar18 = std::ostream::_M_insert<double>((double)local_f8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,", obj ",6);
              poVar18 = std::ostream::_M_insert<double>(local_120);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,", diff ",7);
              poVar18 = std::ostream::_M_insert<double>(local_118 - local_120);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,", reg ",6);
              poVar18 = std::ostream::_M_insert<double>((double)local_130);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
              std::ostream::put((char)poVar18);
              std::ostream::flush();
              if (this->machine_id == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"RMSE of training data: ",0x17);
                auVar40._0_8_ = (double)local_f8 / (double)this->train_rating_num;
                auVar40._8_8_ = 0;
                if (auVar40._0_8_ < 0.0) {
                  dVar28 = sqrt(auVar40._0_8_);
                }
                else {
                  auVar29 = vsqrtsd_avx(auVar40,auVar40);
                  dVar28 = auVar29._0_8_;
                }
                poVar18 = std::ostream::_M_insert<double>(dVar28);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
                std::ostream::put((char)poVar18);
                std::ostream::flush();
              }
            }
            pPVar19 = this->parameter;
            local_118 = local_120;
          }
          local_e8 = local_e8 + local_38;
          uVar22 = (int)local_c8 + 1;
          uVar24 = (ulong)uVar22;
          local_120 = local_118;
          dVar28 = local_118;
        } while ((int)uVar22 < pPVar19->k);
      }
      local_120 = dVar28;
      local_118 = local_120;
      iVar21 = (int)local_100;
      local_100 = (ulong)(iVar21 + 1);
    } while (iVar21 < pPVar19->max_iter);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"training time: ",0xf);
  poVar18 = std::ostream::_M_insert<double>(local_e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," secs",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  operator_delete__(local_108);
  operator_delete__(local_110);
  operator_delete__(local_c0);
  operator_delete__(pvVar15);
  return;
}

Assistant:

void train() {

        // only update the vectors belonging to this machines, but it will keep copies of all vectors from different machines
        value_type *last_q4d = new value_type[Q_workload];
        value_type *last_p4d = new value_type[P_workload];
        value_type *u = new value_type[user_num];
        value_type *v = new value_type[item_num];

        value_type reg = 0;
        value_type prev_obj = 0;

        if (parameter->verbose) {
            for (int d = 0; d < parameter->k; d++) {
                for (int user_index = 0; user_index < end_user_id - start_user_id; user_index++) {
                    // P is zero matrix at the beginning
                    reg += Q[d * Q_workload + user_index] * Q[d * Q_workload + user_index] * user_item_R[user_index + start_user_id].size();
                }
            }

            value_type loss = 0;
            for(auto rating:train_ratings){
                value_type score = rating.score;
                // P is zero matrix at the beginning
//                for (int d = 0; d < parameter->k; d++) {
//                    score -= Q[d * Q_workload + rating.user_id - start_user_id] * P[d * P_workload + rating.item_id - start_item_id];
//                }
                loss += score * score;
            }

            value_type global_reg, global_loss;

            MPI_Allreduce(&reg, &global_reg, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);
            MPI_Allreduce(&loss, &global_loss, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

            value_type obj = global_loss + global_reg * parameter->lambda;

            if(machine_id==0) {
                cout << "machine id " << machine_id << ", iter " << 0 << ", rank " << "None"
                     << ", time " << 0
                     << " sec, loss " << global_loss << ", obj " << obj << ", diff " << "None"
                     << ", reg " << global_reg
                     << endl;
            }

            if(machine_id==0) {
                cout << "RMSE of training data: " << sqrt(global_loss / train_rating_num) << endl;
            }
        }

        Monitor timer;
        value_type total_training_time = 0;

        for (int outer_iter = 1; outer_iter <= parameter->max_iter; outer_iter++) {

            int early_stop = 0;

            value_type fundec_max = 0;

            for (int d = 0; d < parameter->k; d++) {

                timer.start();

                // the factors belonging to this machines
                value_type *q4d = Q + d * Q_workload;
                value_type *p4d = P + d * P_workload;

                init_factor(q4d, p4d, last_q4d, last_p4d);

                MPI_Allgather(q4d, Q_workload, VALUE_MPI_TYPE, u, Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);
                MPI_Allgather(p4d, P_workload, VALUE_MPI_TYPE, v, P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                // it is not stated in the paper, but found in the implementation.
                if(early_stop >= 5) {
                    break;
                }

                // Create Rhat = user_item_R + Wt Ht^T
                if(outer_iter > 1){
                    update_rating(user_item_R, q4d, v, start_user_id, R_workload_update_rating, true);
                    update_rating(item_user_R, p4d, u, start_item_id, Rt_workload_update_rating, true);
                }

                value_type innerfundec_cur = 0;
                value_type global_innerfundec_cur = 0;

                for (int inner_iter = 1; inner_iter <= parameter->max_inner_iter; inner_iter++) {

                    innerfundec_cur = 0;

                    // Update W_t and H_t
                    // Note p should be updated first since it is 0 at the beginning
                    innerfundec_cur += rank_one_update(item_user_R, p4d, u, start_item_id, end_item_id, Rt_workload_rank_one_update);

                    MPI_Allgather(p4d, P_workload, VALUE_MPI_TYPE, v, P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                    innerfundec_cur += rank_one_update(user_item_R, q4d, v, start_user_id, end_user_id, R_workload_rank_one_update);

                    MPI_Allgather(q4d, Q_workload, VALUE_MPI_TYPE, u, Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                    MPI_Allreduce(&innerfundec_cur, &global_innerfundec_cur, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

                    if ((global_innerfundec_cur < fundec_max * parameter->eps)) {
                        if (inner_iter == 1) {
                            early_stop += 1;
                        }
                        break;
                    }

                    // the fundec of the first inner iter of the first rank of the first outer iteration could be too large!!
                    if(!(outer_iter==1 && d == 0 && inner_iter==1)) {
                        fundec_max = std::max(fundec_max, global_innerfundec_cur);
                    }

                }

                // Update user_item_R and item_user_R
                update_rating(user_item_R, q4d, v, start_user_id, R_workload_update_rating, false);
                value_type loss = update_rating(item_user_R, p4d, u, start_user_id, Rt_workload_update_rating, false);

                timer.stop();

                total_training_time += timer.getElapsedTime();

                if (parameter->verbose) {

                    for(int item_index = 0; item_index < end_item_id - start_item_id; item_index++) {
                        value_type c = item_user_R[item_index + start_item_id].size();
                        reg += c * p4d[item_index] * p4d[item_index];
                        reg -= c * last_p4d[item_index] * last_p4d[item_index];
                    }

                    for(int user_index = 0; user_index < end_user_id - start_user_id; user_index++) {
                        value_type c = user_item_R[user_index + start_user_id].size();
                        reg += c * q4d[user_index] * q4d[user_index];
                        reg -= c * last_q4d[user_index] * last_q4d[user_index];
                    }

                    value_type global_reg, global_loss;

                    MPI_Allreduce(&reg, &global_reg, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);
                    MPI_Allreduce(&loss, &global_loss, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

                    value_type obj = global_loss + global_reg * parameter->lambda;

                    if(machine_id==0) {
                        cout << "machine id " << machine_id << ", iter " << outer_iter << ", rank " << d + 1
                             << ", time " << timer.getElapsedTime()
                             << " sec, loss " << global_loss << ", obj " << obj << ", diff " << prev_obj - obj
                             << ", reg " << global_reg
                             << endl;
                    }

                    prev_obj = obj;

                    if(machine_id==0) {
                        cout << "RMSE of training data: " << sqrt(global_loss / train_rating_num) << endl;
                    }
                }
            }
        }

        cout << "training time: " << total_training_time << " secs" << endl;

        delete[] u;
        delete[] v;
        delete[] last_p4d;
        delete[] last_q4d;

    }